

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufUpdateArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *pVVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  
  Abc_BufCollectTfoCone(p,pObj);
  pVVar4 = p->vTfCone;
  iVar7 = pVVar4->nSize;
  if (1 < iVar7) {
    piVar2 = pVVar4->pArray;
    iVar5 = -1;
    lVar6 = 0;
    do {
      iVar1 = piVar2[lVar6];
      piVar2[lVar6] = piVar2[iVar7 + iVar5];
      piVar2[pVVar4->nSize + iVar5] = iVar1;
      lVar6 = lVar6 + 1;
      iVar7 = pVVar4->nSize;
      iVar5 = iVar5 + -1;
    } while (lVar6 < iVar7 / 2);
  }
  pVVar4 = p->vTfCone;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      iVar7 = pVVar4->pArray[lVar6];
      if (((long)iVar7 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj_00 = (Abc_Obj_t *)pVVar3->pArray[iVar7];
      if (pObj_00 != (Abc_Obj_t *)0x0) {
        fVar8 = Abc_BufComputeArr(p,pObj_00);
        iVar7 = (int)fVar8;
        if ((int)fVar8 < p->DelayMax) {
          iVar7 = p->DelayMax;
        }
        p->DelayMax = iVar7;
      }
      lVar6 = lVar6 + 1;
      pVVar4 = p->vTfCone;
    } while (lVar6 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_BufUpdateArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pNext;
    int i, Delay;
//    assert( Abc_ObjIsNode(pObj) );
    Abc_BufCollectTfoCone( p, pObj );
    Vec_IntReverseOrder( p->vTfCone );
    Abc_NtkForEachObjVec( p->vTfCone, p->pNtk, pNext, i )
    {
        Delay = Abc_BufComputeArr( p, pNext );
        p->DelayMax = Abc_MaxInt( p->DelayMax, Delay );
    }
}